

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O1

LY_ERR lydxml_data_skip(lyxml_ctx *xmlctx)

{
  uint uVar1;
  LY_ERR LVar2;
  
  uVar1 = (xmlctx->elements).count;
  if (uVar1 == 0) {
    __assert_fail("parents_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x16f,"LY_ERR lydxml_data_skip(struct lyxml_ctx *)");
  }
  while (xmlctx->status != LYXML_ELEM_CONTENT) {
    LVar2 = lyxml_ctx_next(xmlctx);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
  }
  do {
    LVar2 = lyxml_ctx_next(xmlctx);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
  } while (uVar1 <= (xmlctx->elements).count);
  if (xmlctx->status != LYXML_ELEM_CLOSE) {
    __assert_fail("xmlctx->status == LYXML_ELEM_CLOSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x17d,"LY_ERR lydxml_data_skip(struct lyxml_ctx *)");
  }
  LVar2 = lyxml_ctx_next(xmlctx);
  return LVar2;
}

Assistant:

static LY_ERR
lydxml_data_skip(struct lyxml_ctx *xmlctx)
{
    uint32_t parents_count;

    /* remember current number of parents */
    parents_count = xmlctx->elements.count;
    assert(parents_count);

    /* skip after the content */
    while (xmlctx->status != LYXML_ELEM_CONTENT) {
        LY_CHECK_RET(lyxml_ctx_next(xmlctx));
    }
    LY_CHECK_RET(lyxml_ctx_next(xmlctx));

    /* skip all children elements, recursively, if any */
    while (parents_count <= xmlctx->elements.count) {
        LY_CHECK_RET(lyxml_ctx_next(xmlctx));
    }

    /* close element */
    assert(xmlctx->status == LYXML_ELEM_CLOSE);
    LY_CHECK_RET(lyxml_ctx_next(xmlctx));

    return LY_SUCCESS;
}